

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,pstore::repo::internal_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>
          (rule *this,not_null<const_pstore::exchange::import_ns::string_mapping_*> args,
          vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
          *args_1)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup> *pfVar5;
  ulong uVar6;
  __single_object p;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_40;
  _Head_base<0UL,_pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup>_*,_false>
  local_38;
  
  pfVar5 = (fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup>
            *)operator_new(0x20);
  pcVar2 = (this->context_).ptr_;
  local_40._M_head_impl = (rule *)args_1;
  gsl::
  not_null<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_*>
  ::ensure_invariant((not_null<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_*>
                      *)&local_40);
  (pfVar5->super_rule).context_.ptr_ = pcVar2;
  (pfVar5->super_rule)._vptr_rule = (_func_int **)&PTR__rule_0015d3d8;
  (pfVar5->names_).ptr_ = args.ptr_;
  (pfVar5->fixups_).ptr_ =
       (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
       local_40._M_head_impl;
  local_38._M_head_impl = pfVar5;
  log_top(this,false);
  pcVar2 = (this->context_).ptr_;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::pop_back(&(pcVar2->stack).c);
  local_40._M_head_impl = &(local_38._M_head_impl)->super_rule;
  local_38._M_head_impl =
       (fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup> *)
       0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_40);
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         local_40._M_head_impl;
    local_40._M_head_impl = (rule *)0x0;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_40._M_head_impl != (rule *)0x0) {
    (*(local_40._M_head_impl)->_vptr_rule[1])();
  }
  log_top(this,true);
  uVar6 = std::_V2::system_category();
  std::
  unique_ptr<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup>,_std::default_delete<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup>,_std::default_delete<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,_pstore::repo::internal_fixup>_>_>
                 *)&local_38);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar6;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }